

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O1

void __thiscall QPainterPath::lineTo(QPainterPath *this,QPointF *p)

{
  QList<QPainterPath::Element> *this_00;
  QPainterPathPrivate *pQVar1;
  long lVar2;
  Element *pEVar3;
  bool bVar4;
  byte bVar5;
  iterator iVar6;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  ulong local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar4 = hasValidCoords(*p);
  if (bVar4) {
    if ((this->d_ptr).d.ptr == (QPainterPathPrivate *)0x0) {
      ensureData_helper(this);
    }
    detach(this);
    pQVar1 = (this->d_ptr).d.ptr;
    if ((pQVar1->field_0x84 & 1) != 0) {
      local_48._0_8_ = -NAN;
      local_48._8_8_ = -NAN;
      this_00 = &pQVar1->elements;
      local_38 = (ulong)&DAT_aaaaaaaaaaaaaaaa;
      iVar6 = QList<QPainterPath::Element>::end(this_00);
      local_48._0_8_ = iVar6.i[-1].x;
      local_48._8_8_ = iVar6.i[-1].y;
      local_38 = *(ulong *)&iVar6.i[-1].type & 0xffffffff00000000;
      QtPrivate::QPodArrayOps<QPainterPath::Element>::emplace<QPainterPath::Element_const&>
                ((QPodArrayOps<QPainterPath::Element> *)this_00,(pQVar1->elements).d.size,
                 (Element *)local_48);
      QList<QPainterPath::Element>::end(this_00);
      pQVar1->field_0x84 = pQVar1->field_0x84 & 0xfe;
    }
    pEVar3 = (pQVar1->elements).d.ptr + (pQVar1->elements).d.size + -1;
    local_48._0_8_ = pEVar3->x;
    local_48._8_8_ = pEVar3->y;
    bVar4 = qFuzzyCompare(p,(QPointF *)local_48);
    if (!bVar4) {
      local_48._0_8_ = p->xp;
      local_48._8_8_ = p->yp;
      local_38 = 0xaaaaaaaa00000001;
      QtPrivate::QPodArrayOps<QPainterPath::Element>::emplace<QPainterPath::Element_const&>
                ((QPodArrayOps<QPainterPath::Element> *)&pQVar1->elements,(pQVar1->elements).d.size,
                 (Element *)local_48);
      QList<QPainterPath::Element>::end(&pQVar1->elements);
      lVar2 = (pQVar1->elements).d.size;
      if (lVar2 == 3) {
        bVar5 = 0x10;
      }
      else if (lVar2 == 4) {
        pEVar3 = (pQVar1->elements).d.ptr;
        lVar2 = (pQVar1->elements).d.size;
        bVar5 = (-(pEVar3[lVar2 + -1].y == pEVar3[pQVar1->cStart].y) &
                 -(pEVar3[pQVar1->cStart].x == pEVar3[lVar2 + -1].x) & 1U) << 4;
      }
      else {
        bVar5 = 0;
      }
      pQVar1->field_0x84 = pQVar1->field_0x84 & 0xef | bVar5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainterPath::lineTo(const QPointF &p)
{
#ifdef QPP_DEBUG
    printf("QPainterPath::lineTo() (%.2f,%.2f)\n", p.x(), p.y());
#endif

    if (!hasValidCoords(p)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::lineTo: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    ensureData();
    detach();

    QPainterPathPrivate *d = d_func();
    Q_ASSERT(!d->elements.isEmpty());
    d->maybeMoveTo();
    if (p == QPointF(d->elements.constLast()))
        return;
    Element elm = { p.x(), p.y(), LineToElement };
    d->elements.append(elm);

    d->convex = d->elements.size() == 3 || (d->elements.size() == 4 && d->isClosed());
}